

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O0

void embree::renderTileTask
               (int taskIndex,int threadIndex,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,int numTilesX,int numTilesY)

{
  uint uVar1;
  uint in_ECX;
  uint uVar2;
  int in_EDI;
  uint in_R8D;
  float unaff_retaddr;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  int *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  uint x;
  uint y;
  uint y1;
  uint y0;
  uint x1;
  uint x0;
  uint tileX;
  uint tileY;
  ISPCCamera *in_stack_00000240;
  RayStats *in_stack_00000248;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  
  uVar1 = (in_EDI - (in_EDI / (int)in_stack_00000008) * in_stack_00000008) * 8;
  uVar2 = uVar1 + 8;
  local_5c = in_ECX;
  if (uVar2 < in_ECX) {
    local_5c = uVar2;
  }
  local_54 = (in_EDI / (int)in_stack_00000008) * 8;
  local_60 = in_R8D;
  if (local_54 + 8 < in_R8D) {
    local_60 = local_54 + 8;
  }
  for (; local_58 = uVar1, local_54 < local_60; local_54 = local_54 + 1) {
    for (; local_58 < local_5c; local_58 = local_58 + 1) {
      renderPixelStandard(_x,in_stack_0000001c,in_stack_00000018,in_stack_00000010,in_stack_0000000c
                          ,in_stack_00000008,unaff_retaddr,in_stack_00000240,in_stack_00000248);
    }
  }
  return;
}

Assistant:

void renderTileTask (int taskIndex, int threadIndex, int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera,
                         const int numTilesX,
                         const int numTilesY)
{
  const unsigned int tileY = taskIndex / numTilesX;
  const unsigned int tileX = taskIndex - tileY * numTilesX;
  const unsigned int x0 = tileX * TILE_SIZE_X;
  const unsigned int x1 = min(x0+TILE_SIZE_X,width);
  const unsigned int y0 = tileY * TILE_SIZE_Y;
  const unsigned int y1 = min(y0+TILE_SIZE_Y,height);

  for (unsigned int y=y0; y<y1; y++) for (unsigned int x=x0; x<x1; x++)
  {
    renderPixelStandard(data,x,y,pixels,width,height,time,camera,g_stats[threadIndex]);
  }
}